

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccmake.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char **argv_00;
  long lVar7;
  cmCursesMainForm *this;
  ostream *poVar8;
  long *plVar9;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  uint initWidth;
  ulong uVar10;
  ulong uVar11;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  CommandLineArguments encoding_args;
  cmDocumentation doc;
  string cacheDir;
  string local_518;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  undefined1 local_4d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  CommandLineArguments local_4a0;
  _Any_data local_488;
  code *local_478;
  code *pcStack_470;
  cmDocumentation local_460;
  undefined1 local_3b8 [904];
  
  cmSystemTools::EnsureStdPipes();
  cmsys::Encoding::CommandLineArguments::Main(&local_4a0,argc,argv);
  uVar5 = cmsys::Encoding::CommandLineArguments::argc(&local_4a0);
  argv_00 = cmsys::Encoding::CommandLineArguments::argv(&local_4a0);
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(*argv_00);
  cmDocumentation::cmDocumentation(&local_460);
  cmDocumentation::addCMakeStandardDocSections(&local_460);
  bVar4 = cmDocumentation::CheckOptions(&local_460,uVar5,argv_00,(char *)0x0);
  if (bVar4) {
    cmake::cmake((cmake *)local_3b8,RoleInternal,Unknown);
    paVar1 = &local_518.field_2;
    local_518._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"");
    cmake::SetHomeDirectory((cmake *)local_3b8,&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != paVar1) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    local_518._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"");
    cmake::SetHomeOutputDirectory((cmake *)local_3b8,&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != paVar1) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    cmake::AddCMakePaths((cmake *)local_3b8);
    cmake::GetGeneratorsDocumentation
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d8,
               (cmake *)local_3b8);
    local_518._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"ccmake","");
    cmDocumentation::SetName(&local_460,&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != paVar1) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    cmDocumentation::SetSection(&local_460,"Name",cmDocumentationName);
    cmDocumentation::SetSection(&local_460,"Usage",cmDocumentationUsage);
    if (uVar5 == 1) {
      cmDocumentation::AppendSection(&local_460,"Usage",cmDocumentationUsageNote);
    }
    cmDocumentation::AppendSection
              (&local_460,"Generators",
               (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d8);
    cmDocumentation::PrependSection(&local_460,"Options",cmDocumentationOptions);
    bVar4 = cmDocumentation::PrintRequestedDocumentation(&local_460,(ostream *)&std::cout);
    uVar5 = (uint)!bVar4;
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d8);
    cmake::~cmake((cmake *)local_3b8);
  }
  else {
    local_4f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((int)uVar5 < 1) {
      bVar4 = false;
      collapse = extraout_DL;
    }
    else {
      uVar10 = (ulong)uVar5;
      bVar4 = false;
      do {
        iVar6 = strcmp(*argv_00,"-debug");
        if (iVar6 == 0) {
          bVar4 = true;
          collapse = extraout_DL_00;
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4f8
                     ,argv_00);
          collapse = extraout_DL_01;
        }
        argv_00 = argv_00 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_3b8,(SystemTools *)0x1,(bool)collapse);
    if (0x20 < (ulong)((long)local_4f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_4f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      uVar10 = 1;
      uVar11 = 2;
      do {
        pcVar2 = local_4f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
        local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_518,pcVar2,
                   pcVar2 + local_4f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length);
        lVar7 = std::__cxx11::string::find((char *)&local_518,0x4e9d31,0);
        if (lVar7 == 0) {
          std::__cxx11::string::substr((ulong)local_4d8,(ulong)&local_518);
          std::__cxx11::string::operator=((string *)local_3b8,(string *)local_4d8);
          if ((pointer)local_4d8._0_8_ != (pointer)(local_4d8 + 0x10)) {
            operator_delete((void *)local_4d8._0_8_,
                            (ulong)((long)&(((string *)local_4d8._16_8_)->_M_dataplus)._M_p + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        bVar3 = uVar11 < (ulong)((long)local_4f8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_4f8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar10 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar3);
    }
    cmSystemTools::s_DisableRunCommandOutput = true;
    if (bVar4) {
      cmCursesForm::DebugStart();
    }
    initscr();
    noecho();
    cbreak();
    keypad(_stdscr,1);
    signal(0x1c,onsig);
    initWidth = 0xffffffff;
    uVar5 = 0xffffffff;
    if (_stdscr != 0) {
      uVar5 = (int)*(short *)(_stdscr + 4) + 1;
      initWidth = (int)*(short *)(_stdscr + 6) + 1;
    }
    if (((int)initWidth < 0x41) || ((int)uVar5 < 6)) {
      endwin();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Window is too small. A size of at least ",0x28);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,0x41);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," x ",3);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," is required to run ccmake.",0x1b);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      uVar5 = 1;
      std::ostream::flush();
    }
    else {
      this = (cmCursesMainForm *)operator_new(0x110);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4b8,&local_4f8);
      cmCursesMainForm::cmCursesMainForm(this,&local_4b8,initWidth);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4b8);
      iVar6 = cmCursesMainForm::LoadCache(this,(char *)local_3b8._0_8_);
      if (iVar6 == 0) {
        local_488._8_8_ = 0;
        pcStack_470 = std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/ccmake.cxx:154:5)>
                      ::_M_invoke;
        local_478 = std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/ccmake.cxx:154:5)>
                    ::_M_manager;
        local_488._M_unused._0_8_ = (undefined8)this;
        cmSystemTools::SetMessageCallback((MessageCallback *)&local_488);
        if (local_478 != (code *)0x0) {
          (*local_478)(&local_488,&local_488,__destroy_functor);
        }
        cmCursesForm::CurrentForm = (cmCursesForm *)this;
        cmCursesMainForm::InitializeUI(this);
        iVar6 = cmCursesMainForm::Configure(this,1);
        if (iVar6 == 0) {
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                    (this,1,1,(ulong)initWidth,(ulong)uVar5);
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[2])(this);
        }
        erase();
        clearok(_stdscr,1);
        if (_stdscr == 0) {
          iVar6 = -1;
        }
        else {
          iVar6 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar6,1);
        endwin();
        if (cmCursesForm::CurrentForm != (cmCursesForm *)0x0) {
          (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[1])();
        }
        cmCursesForm::CurrentForm = (cmCursesForm *)0x0;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        plVar9 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        uVar5 = 0;
        std::ostream::flush();
      }
      else {
        erase();
        clearok(_stdscr,1);
        if (_stdscr == 0) {
          iVar6 = -1;
        }
        else {
          iVar6 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar6,1);
        endwin();
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[1])(this);
        uVar5 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error running cmake::LoadCache().  Aborting.\n",0x2d);
      }
    }
    if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
      operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4f8);
  }
  cmDocumentationFormatter::~cmDocumentationFormatter(&local_460.Formatter);
  std::
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>::
  ~vector(&local_460.RequestedHelpItems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.CurrentArgument._M_dataplus._M_p != &local_460.CurrentArgument.field_2) {
    operator_delete(local_460.CurrentArgument._M_dataplus._M_p,
                    local_460.CurrentArgument.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>_>
  ::~_Rb_tree(&local_460.AllSections._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.NameString._M_dataplus._M_p != &local_460.NameString.field_2) {
    operator_delete(local_460.NameString._M_dataplus._M_p,
                    local_460.NameString.field_2._M_allocated_capacity + 1);
  }
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_4a0);
  return uVar5;
}

Assistant:

int main(int argc, char const* const* argv)
{
  cmSystemTools::EnsureStdPipes();
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(argv[0]);
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if (doc.CheckOptions(argc, argv)) {
    cmake hcm(cmake::RoleInternal, cmState::Unknown);
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();
    auto generators = hcm.GetGeneratorsDocumentation();
    doc.SetName("ccmake");
    doc.SetSection("Name", cmDocumentationName);
    doc.SetSection("Usage", cmDocumentationUsage);
    if (argc == 1) {
      doc.AppendSection("Usage", cmDocumentationUsageNote);
    }
    doc.AppendSection("Generators", generators);
    doc.PrependSection("Options", cmDocumentationOptions);
    return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
  }

  bool debug = false;
  unsigned int i;
  int j;
  std::vector<std::string> args;
  for (j = 0; j < argc; ++j) {
    if (strcmp(argv[j], "-debug") == 0) {
      debug = true;
    } else {
      args.emplace_back(argv[j]);
    }
  }

  std::string cacheDir = cmSystemTools::GetCurrentWorkingDirectory();
  for (i = 1; i < args.size(); ++i) {
    std::string arg = args[i];
    if (arg.find("-B", 0) == 0) {
      cacheDir = arg.substr(2);
    }
  }

  cmSystemTools::DisableRunCommandOutput();

  if (debug) {
    cmCursesForm::DebugStart();
  }

  initscr();            /* Initialization */
  noecho();             /* Echo off */
  cbreak();             /* nl- or cr not needed */
  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  signal(SIGWINCH, onsig);

  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
    endwin();
    std::cerr << "Window is too small. A size of at least "
              << cmCursesMainForm::MIN_WIDTH << " x "
              << cmCursesMainForm::MIN_HEIGHT << " is required to run ccmake."
              << std::endl;
    return 1;
  }

  cmCursesMainForm* myform;

  myform = new cmCursesMainForm(args, x);
  if (myform->LoadCache(cacheDir.c_str())) {
    curses_clear();
    touchwin(stdscr);
    endwin();
    delete myform;
    std::cerr << "Error running cmake::LoadCache().  Aborting.\n";
    return 1;
  }

  cmSystemTools::SetMessageCallback(
    [myform](const std::string& message, const char* title) {
      myform->AddError(message, title);
    });

  cmCursesForm::CurrentForm = myform;

  myform->InitializeUI();
  if (myform->Configure(1) == 0) {
    myform->Render(1, 1, x, y);
    myform->HandleInput();
  }

  // Need to clean-up better
  curses_clear();
  touchwin(stdscr);
  endwin();
  delete cmCursesForm::CurrentForm;
  cmCursesForm::CurrentForm = nullptr;

  std::cout << std::endl << std::endl;

  return 0;
}